

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O3

int get_relative_field_bit_offset_by_index
              (coda_cursor *cursor,long field_index,int64_t *rel_bit_offset)

{
  int64_t *piVar1;
  coda_dynamic_type_struct *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *message;
  coda_expression *pcVar7;
  long lVar8;
  long lVar9;
  int available_1;
  int64_t prev_bit_offset;
  int64_t bit_size;
  coda_cursor field_cursor;
  int local_364;
  long local_360;
  long *local_358;
  anon_struct_24_3_5e6533e2 *local_350;
  long local_348;
  coda_cursor local_340;
  
  pcVar2 = cursor->stack[(long)cursor->n + -1].type;
  lVar6 = *(long *)(*(long *)(pcVar2 + 5) + field_index * 8);
  if (*(long *)(lVar6 + 0x28) < 0) {
    pcVar7 = *(coda_expression **)(lVar6 + 0x30);
    if (pcVar7 == (coda_expression *)0x0) {
      if (field_index == 0) {
        __assert_fail("field_index != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,99,
                      "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                     );
      }
      local_350 = cursor->stack;
      lVar9 = 1;
      lVar6 = field_index;
      while ((lVar8 = *(long *)(*(long *)(pcVar2 + 5) + -8 + lVar6 * 8),
             *(long *)(lVar8 + 0x28) == -1 && (*(long *)(lVar8 + 0x30) == 0))) {
        lVar9 = lVar9 + 1;
        bVar3 = lVar6 < 2;
        lVar6 = lVar6 + -1;
        if (bVar3) {
          __assert_fail("index >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                        ,0x6e,
                        "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                       );
        }
      }
      lVar8 = lVar6 + -1;
      local_358 = rel_bit_offset;
      iVar4 = get_relative_field_bit_offset_by_index(cursor,lVar8,&local_360);
      if (iVar4 != 0) {
        return -1;
      }
      memcpy(&local_340,cursor,0x310);
      lVar5 = (long)local_340.n;
      local_340.n = local_340.n + 1;
      local_340.stack[lVar5].bit_offset = local_350[(long)cursor->n + -1].bit_offset + local_360;
      if (lVar6 <= field_index) {
        do {
          local_364 = 1;
          pcVar7 = *(coda_expression **)(*(long *)(*(long *)(pcVar2 + 5) + lVar8 * 8) + 0x20);
          if (pcVar7 == (coda_expression *)0x0) {
LAB_00119107:
            lVar6 = (long)local_340.n;
            local_340.stack[lVar6 + -1].type =
                 *(coda_dynamic_type_struct **)(*(long *)(*(long *)(pcVar2 + 5) + lVar8 * 8) + 0x10)
            ;
            local_340.stack[lVar6 + -1].index = lVar8;
            iVar4 = coda_cursor_get_bit_size(&local_340,&local_348);
            if (iVar4 != 0) {
              return -1;
            }
            local_360 = local_360 + local_348;
            piVar1 = &local_340.stack[(long)local_340.n + -1].bit_offset;
            *piVar1 = *piVar1 + local_348;
          }
          else {
            iVar4 = coda_expression_eval_bool(pcVar7,cursor,&local_364);
            if (iVar4 != 0) {
              coda_add_error_message(" for available expression");
              return -1;
            }
            if (local_364 != 0) goto LAB_00119107;
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      *local_358 = local_360;
      return 0;
    }
    if (*(coda_expression **)(lVar6 + 0x20) != (coda_expression *)0x0) {
      iVar4 = coda_expression_eval_bool
                        (*(coda_expression **)(lVar6 + 0x20),cursor,(int *)&local_340);
      if (iVar4 != 0) {
        message = " for available expression";
        goto LAB_00119192;
      }
      if ((int)local_340.product == 0) {
        if (field_index == 0) {
          *rel_bit_offset = 0;
          return 0;
        }
        iVar4 = get_relative_field_bit_offset_by_index(cursor,field_index + -1,rel_bit_offset);
        return iVar4;
      }
      pcVar7 = *(coda_expression **)(lVar6 + 0x30);
    }
    iVar4 = coda_expression_eval_integer(pcVar7,cursor,rel_bit_offset);
    if (iVar4 != 0) {
      message = " for offset expression";
LAB_00119192:
      coda_add_error_message(message);
      coda_cursor_add_to_error_message(cursor);
      return -1;
    }
  }
  else {
    *rel_bit_offset = *(long *)(lVar6 + 0x28);
  }
  return 0;
}

Assistant:

static int get_relative_field_bit_offset_by_index(const coda_cursor *cursor, long field_index, int64_t *rel_bit_offset)
{
    coda_type_record_field *field;
    coda_type_record *record;
    coda_cursor field_cursor;
    int64_t prev_bit_offset;
    long index;
    long i;

    record = (coda_type_record *)cursor->stack[cursor->n - 1].type;
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        return 0;
    }

    if (field->bit_offset_expr != NULL)
    {
        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                if (field_index == 0)
                {
                    /* Just set to 0. With a proper format definition you should actually never have this case. */
                    *rel_bit_offset = 0;
                    return 0;
                }
                else
                {
                    /* the size of this field is zero, so just use the offset of the previous field */
                    return get_relative_field_bit_offset_by_index(cursor, field_index - 1, rel_bit_offset);
                }
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    assert(field_index != 0);   /* the first field should either have a fixed bit offset or a bit_offset_expr */

    /* determine offset by:
     *  - finding previous field with a fixed bit_offset or a bit_offset_expr
     *  - calculating the bit offset for that field
     *  - adding bit sizes of fields after that offset until we get to our field
     */
    index = field_index - 1;
    while (record->field[index]->bit_offset == -1 && record->field[index]->bit_offset_expr == NULL)
    {
        index--;
        assert(index >= 0);
    }
    if (get_relative_field_bit_offset_by_index(cursor, index, &prev_bit_offset) != 0)
    {
        return -1;
    }
    field_cursor = *cursor;
    field_cursor.n++;
    field_cursor.stack[field_cursor.n - 1].bit_offset = cursor->stack[cursor->n - 1].bit_offset + prev_bit_offset;
    for (i = index; i < field_index; i++)
    {
        int64_t bit_size;
        int available = 1;

        if (record->field[i]->available_expr != NULL)
        {
            if (coda_expression_eval_bool(record->field[i]->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                return -1;
            }
        }
        if (available)
        {
            field_cursor.stack[field_cursor.n - 1].type = (coda_dynamic_type *)record->field[i]->type;
            field_cursor.stack[field_cursor.n - 1].index = i;
            if (coda_cursor_get_bit_size(&field_cursor, &bit_size) != 0)
            {
                return -1;
            }
            prev_bit_offset += bit_size;
            field_cursor.stack[field_cursor.n - 1].bit_offset += bit_size;
        }
    }
    *rel_bit_offset = prev_bit_offset;

    return 0;
}